

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::RawDescriptor::ToStringExtra_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  
  uVar1 = *(uint *)((long)this + 0x74);
  uVar3 = uVar1 - 0x1d;
  lVar2 = *(long *)((long)this + 0x58);
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
    lVar2 = (long)this + 0x58;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    s.m_size._0_4_ = uVar3;
    s.m_data = (uchar *)lVar2;
    s.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(__return_storage_ptr__,s);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToStringExtra() const override { return HexStr(m_script); }